

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O1

Definitions * __thiscall
dg::dda::MemorySSATransformation::getBBlockDefinitions
          (MemorySSATransformation *this,RWBBlock *b,DefSite *ds)

{
  RWNodeCall *C;
  mapped_type *this_00;
  mapped_type *this_01;
  _List_node_base *p_Var1;
  key_type local_28;
  
  local_28 = (key_type)b->subgraph;
  this_00 = std::__detail::
            _Map_base<const_dg::dda::RWSubgraph_*,_std::pair<const_dg::dda::RWSubgraph_*const,_dg::dda::MemorySSATransformation::SubgraphInfo>,_std::allocator<std::pair<const_dg::dda::RWSubgraph_*const,_dg::dda::MemorySSATransformation::SubgraphInfo>_>,_std::__detail::_Select1st,_std::equal_to<const_dg::dda::RWSubgraph_*>,_std::hash<const_dg::dda::RWSubgraph_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<const_dg::dda::RWSubgraph_*,_std::pair<const_dg::dda::RWSubgraph_*const,_dg::dda::MemorySSATransformation::SubgraphInfo>,_std::allocator<std::pair<const_dg::dda::RWSubgraph_*const,_dg::dda::MemorySSATransformation::SubgraphInfo>_>,_std::__detail::_Select1st,_std::equal_to<const_dg::dda::RWSubgraph_*>,_std::hash<const_dg::dda::RWSubgraph_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->_subgraphs_info,(key_type *)&local_28);
  local_28 = b;
  this_01 = std::__detail::
            _Map_base<dg::dda::RWBBlock_*,_std::pair<dg::dda::RWBBlock_*const,_dg::dda::MemorySSATransformation::BBlockInfo>,_std::allocator<std::pair<dg::dda::RWBBlock_*const,_dg::dda::MemorySSATransformation::BBlockInfo>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWBBlock_*>,_std::hash<dg::dda::RWBBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<dg::dda::RWBBlock_*,_std::pair<dg::dda::RWBBlock_*const,_dg::dda::MemorySSATransformation::BBlockInfo>,_std::allocator<std::pair<dg::dda::RWBBlock_*const,_dg::dda::MemorySSATransformation::BBlockInfo>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWBBlock_*>,_std::hash<dg::dda::RWBBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,&local_28);
  if ((this_01->definitions)._processed == false) {
    C = this_01->call;
    if (C == (RWNodeCall *)0x0) {
      for (p_Var1 = (b->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>)._nodes.
                    super__List_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
                    _M_node.super__List_node_base._M_next;
          p_Var1 != (_List_node_base *)
                    &(b->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>)._nodes;
          p_Var1 = p_Var1->_M_next) {
        Definitions::update(&this_01->definitions,(RWNode *)p_Var1[1]._M_next,(RWNode *)0x0);
      }
      (this_01->definitions)._processed = true;
    }
    else if (ds == (DefSite *)0x0) {
      fillDefinitionsFromCall(this,&this_01->definitions,C);
    }
    else {
      fillDefinitionsFromCall(this,&this_01->definitions,C,ds);
    }
  }
  return &this_01->definitions;
}

Assistant:

Definitions &MemorySSATransformation::getBBlockDefinitions(RWBBlock *b,
                                                           const DefSite *ds) {
    auto &bi = getBBlockInfo(b);
    auto &D = bi.getDefinitions();

    if (D.isProcessed()) {
        DBG(dda, "Retrived processed definitions for block " << b->getID());
        return D;
    }

    if (bi.isCallBlock()) {
        if (ds) {
            fillDefinitionsFromCall(D, bi.getCall(), *ds);
            DBG(dda,
                "Retrived (partial) definitions for call block " << b->getID());
        } else {
            DBG(dda, "Filling all definitions for call block " << b->getID());
            fillDefinitionsFromCall(D, bi.getCall());
            assert(D.isProcessed());
        }
    } else {
        performLvn(D, b); // normal basic block
        assert(D.isProcessed());
        DBG(dda, "Retrived LVN'd definitions for block " << b->getID());
    }
    return D;
}